

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

bool __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
::ConvertAllFrom(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
                 *this,int *i_last)

{
  int iVar1;
  bool bVar2;
  ConstraintAcceptanceLevel CVar3;
  int iVar4;
  size_type sVar5;
  reference pCVar6;
  iterator *this_00;
  long __n;
  
  __n = (long)*i_last;
  CVar3 = BasicConstraintKeeper::GetChosenAcceptanceLevel(&this->super_BasicConstraintKeeper);
  bVar2 = IfConsiderConversion(this);
  if ((bVar2) || (CVar3 == AcceptedButNotRecommended)) {
    sVar5 = std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container>_>
            ::size(&this->cons_);
    iVar4 = (int)sVar5;
  }
  else {
    this_00 = &(this->cons_).
               super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container>_>
               ._M_impl.super__Deque_impl_data._M_start;
    while( true ) {
      __n = __n + 1;
      sVar5 = std::
              deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container>_>
              ::size(&this->cons_);
      iVar4 = (int)sVar5;
      if ((int)__n == iVar4) break;
      pCVar6 = std::
               _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container_*>
               ::operator[](this_00,__n);
      if (pCVar6->is_unused_ == '\0' && pCVar6->is_bridged_ == '\0') {
        std::
        _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>::Container_*>
        ::operator[](this_00,__n);
      }
    }
  }
  iVar1 = *i_last;
  *i_last = iVar4 + -1;
  return iVar1 != iVar4 + -1;
}

Assistant:

bool ConvertAllFrom(int& i_last) {
    int i=i_last;
    const auto acceptanceLevel =
        GetChosenAcceptanceLevel();
    if (IfConsiderConversion()) {
      if (!IfConverterConverts(GetConverter())) {
        i = (int)cons_.size();             // skip unconverted items
      } else {
        for ( ; ++i!=(int)cons_.size(); )
          if (!cons_[i].IsRedundant() &&
              !GetConverter().IfDelayConversion(cons_[i].GetCon(), i)) {
            ConvertConstraint(cons_[i], i);
            if (-2 == GetLowLevelAcc()) {
              GetConverter().GetEnv().warn_from_cb(GetShortTypeName());
            }
          }
      }
    }
    else if (ConstraintAcceptanceLevel::AcceptedButNotRecommended == acceptanceLevel) {
      if (!IfConverterConverts(GetConverter())) {
        i = (int)cons_.size();
      } else {
        for (; ++i != (int)cons_.size(); ) {
          if (!cons_[i].IsRedundant() &&
              !GetConverter().IfDelayConversion(cons_[i].GetCon(), i)) {
            try {       // Try to convert all but allow failure
              ConvertConstraint(cons_[i], i);
            } catch (const ConstraintConversionGracefulFailure& ) {
              /// nothing
            } catch (const ConstraintConversionFailure& ccf) {
              GetConverter().AddWarning( ccf.key(), ccf.message() );
            }
          }
        }
      }
    } else { // Recommended == acceptanceLevel &&
      for (; ++i != (int)cons_.size(); )
        if (!cons_[i].IsRedundant() &&
            GetConverter().IfNeedsConversion(cons_[i].GetCon(), i))
          ConvertConstraint(cons_[i], i);
    }
    bool any_converted = i_last!=i-1;
    i_last = i-1;
    return any_converted;
  }